

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(void)

{
  _Map_pointer *this;
  uint uVar1;
  Entity *e;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_fe_hp_fem_L_shape_main_cc:27:43)>_>_>_>
  __x;
  double dVar2;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  bool bVar3;
  int iVar4;
  int iVar5;
  ComputationInfo CVar6;
  element_type *peVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference ppEVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference ppEVar9;
  vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_> *pvVar10;
  reference ppEVar11;
  undefined4 extraout_var_03;
  uint *puVar12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  element_type *peVar13;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ostream *poVar14;
  Scalar *pSVar15;
  runtime_error *prVar16;
  Scalar *pSVar17;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  bool *pbVar18;
  Transpose<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *args;
  CwiseNullaryOp<Eigen::internal::linspaced_op<int>,_Eigen::Matrix<int,_1,__1,_1,_1,__1>_> *args_00;
  Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *args_01;
  string *name;
  v10 *pvVar19;
  Solve<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  SVar20;
  undefined1 local_1320 [16];
  size_t local_1310;
  Scalar local_1308 [2];
  RandomAccessLinSpacedReturnType local_1300;
  char *local_12e0;
  v10 *local_12d8;
  undefined1 local_12d0 [16];
  size_t local_12c0;
  undefined1 local_12b8 [16];
  Entity *edge_p_2;
  iterator __end5_1;
  iterator __begin5_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range5_1;
  Entity *ep_4;
  iterator __end3_3;
  iterator __begin3_3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3_3;
  undefined1 local_1240 [8];
  CodimMeshDataSet<bool> marked_edges;
  string local_1200;
  allocator<char> local_11d9;
  string local_11d8;
  string local_11b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1178;
  shared_ptr<const_lf::mesh::Mesh> local_1158;
  undefined1 local_1148 [8];
  VtkWriter vtk;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_fe_hp_fem_L_shape_main_cc:27:43)>_>
  local_f68;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_fe_hp_fem_L_shape_main_cc:27:43)>_>_>
  local_f30;
  double local_ef0;
  double L2error;
  shared_ptr<const_lf::fe::ScalarFESpace<double>_> local_ed8;
  undefined1 local_ec8 [8];
  MeshFunctionFE<double,_double> solution_mf;
  allocator<char> local_e81;
  string local_e80;
  allocator<char> local_e59;
  string local_e58;
  stringstream local_e38 [8];
  stringstream ss_1;
  ostream local_e28 [376];
  Solve<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_cb0;
  undefined1 local_ca0 [8];
  Matrix<double,__1,_1,_0,__1,_1> solution_vec;
  allocator<char> local_c69;
  string local_c68;
  allocator<char> local_c41;
  string local_c40;
  stringstream local_c20 [8];
  stringstream ss;
  ostream local_c10 [376];
  undefined1 local_a98 [8];
  SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> solver;
  SparseMatrix<double,_0,_int> lhs;
  anon_class_8_1_1f9920ea local_990;
  undefined1 local_988 [8];
  vector<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_> bnd_cond;
  VectorXd rhs;
  COOMatrix<double> lhs_coo;
  shared_ptr<const_lf::fe::ScalarFESpace<double>_> local_938;
  undefined1 local_928 [8];
  DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
  diffusion_emp;
  undefined1 local_770 [8];
  CodimMeshDataSet<bool> on_boundary;
  undefined1 local_730 [4];
  size_type num_dof;
  shared_ptr<lf::fe::HierarchicScalarFESpace<double>_> fes;
  Entity *edge_p_1;
  iterator __end3_2;
  iterator __begin3_2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3_2;
  Entity *pEStack_6e8;
  uint element_degree;
  Entity *ep_3;
  iterator __end2_3;
  iterator __begin2_3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2_3;
  Entity *edge_p;
  iterator __end2_2;
  iterator __begin2_2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2_2;
  reference local_680;
  Entity **neighbor;
  iterator __end6;
  iterator __begin6;
  vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_> *__range6;
  Entity **sp_1;
  iterator __end5;
  iterator __begin5;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range5;
  Entity **ep_2;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3_1;
  uint i;
  Entity **ep_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_> *__range2_1;
  undefined1 local_5c8 [8];
  AllCodimMeshDataSet<unsigned_int> degrees;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> local_588;
  Entity **local_578;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> local_570;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_560;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_558;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  origin;
  Matrix<double,_0,_1,_0,_0,_1> zero;
  Entity **sp;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  Entity **ep;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  undefined1 local_4d8 [8];
  CodimMeshDataSet<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
  adjacent_cells;
  shared_ptr<lf::mesh::Mesh> mesh;
  size_type level;
  VectorXi num_dofs;
  undefined1 local_470 [8];
  VectorXd errors;
  size_type max_level;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_450;
  undefined1 local_448 [24];
  MeshHierarchy mesh_hierarchy;
  MeshFunctionConstant<double> diffusion_coefficient;
  undefined1 local_370 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_fe_hp_fem_L_shape_main_cc:27:43)>
  exact_solution;
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_338;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_330;
  undefined1 local_328 [8];
  GmshReader reader;
  path local_268;
  path local_240;
  undefined1 local_218 [8];
  path path;
  format_args local_1e8;
  char *local_1d8;
  size_t local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_Eigen::Transpose<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  *local_1c8 [2];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_Eigen::Transpose<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  *vargs;
  char *local_1a8;
  size_t sStack_1a0;
  format_args local_198;
  char *local_188;
  v10 *local_180;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,_Eigen::Matrix<int,_1,__1,_1,_1,__1>_>_>
  *local_178 [2];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_168;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,_Eigen::Matrix<int,_1,__1,_1,_1,__1>_>_>
  *vargs_1;
  char *local_158;
  v10 *pvStack_150;
  format_args local_148;
  char *local_138;
  size_t local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *local_128 [3];
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *vargs_2;
  char *local_100;
  size_t sStack_f8;
  char **local_f0;
  char *local_e8;
  size_t sStack_e0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_d0;
  format_args *local_c8;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_c0;
  undefined8 local_b8;
  format_args *local_b0;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a8;
  char **local_a0;
  char *local_98;
  v10 *pvStack_90;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_80;
  format_args *local_78;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_70;
  undefined8 local_68;
  format_args *local_60;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_58;
  char **local_50;
  char *local_48;
  size_t sStack_40;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_38;
  format_args *local_30;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_28;
  undefined8 local_20;
  format_args *local_18;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_10;
  
  path._36_4_ = 0;
  std::filesystem::__cxx11::path::path<char[106],std::filesystem::__cxx11::path>
            ((path *)local_218,
             (char (*) [106])
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/fe/hp_fem_L_shape/main.cc"
             ,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
            ((path *)&reader.nr_2_name_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (char (*) [12])"L_shape.msh",auto_format);
  std::filesystem::__cxx11::operator/
            (&local_240,&local_268,
             (path *)&reader.nr_2_name_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::filesystem::__cxx11::path::operator=((path *)local_218,&local_240);
  std::filesystem::__cxx11::path::~path(&local_240);
  std::filesystem::__cxx11::path::~path
            ((path *)&reader.nr_2_name_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::filesystem::__cxx11::path::~path(&local_268);
  std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&local_338);
  std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
            ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
             &local_330,&local_338);
  std::filesystem::__cxx11::path::string((string *)&exact_solution.field_0x8,(path *)local_218);
  lf::io::GmshReader::GmshReader
            ((GmshReader *)local_328,&local_330,(string *)&exact_solution.field_0x8);
  std::__cxx11::string::~string((string *)&exact_solution.field_0x8);
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
            (&local_330);
  std::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ::~unique_ptr(&local_338);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/fe/hp_fem_L_shape/main.cc:27:43)>
  ::MeshFunctionGlobal
            ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_fe_hp_fem_L_shape_main_cc:27:43)>
              *)local_370);
  lf::mesh::utils::MeshFunctionConstant<double>::MeshFunctionConstant
            ((MeshFunctionConstant<double> *)
             &mesh_hierarchy.refinement_edges_.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,1.0);
  lf::io::GmshReader::mesh((GmshReader *)local_448);
  errors.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 2;
  std::make_unique<lf::mesh::hybrid2d::MeshFactory,int>((int *)&max_level);
  std::unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>>::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,std::default_delete<lf::mesh::hybrid2d::MeshFactory>,void>
            ((unique_ptr<lf::mesh::MeshFactory,std::default_delete<lf::mesh::MeshFactory>> *)
             &local_450,
             (unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
              *)&max_level);
  lf::refinement::MeshHierarchy::MeshHierarchy
            ((MeshHierarchy *)(local_448 + 0x10),(shared_ptr<lf::mesh::Mesh> *)local_448,&local_450)
  ;
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
            (&local_450);
  std::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ::~unique_ptr((unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                 *)&max_level);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)local_448);
  errors.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ = 9;
  num_dofs.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 10;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_470,
             (uint *)((long)&num_dofs.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + 4));
  mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 10;
  name = (string *)
         ((long)&mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi + 4);
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<int,__1,_1,_0,__1,_1> *)&level,(uint *)name);
  mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  while( true ) {
    if (9 < (uint)mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi) {
      local_12d0._8_8_ = "# dofs      : {}\n";
      local_12c0 = 0x11;
      local_12d0._0_8_ =
           Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::transpose
                     ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&level);
      local_1a8 = (char *)local_12d0._8_8_;
      sStack_1a0 = local_12c0;
      vargs = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_Eigen::Transpose<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
               *)local_12d0;
      local_1c8[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,Eigen::Transpose<Eigen::Matrix<int,_1,1,0,_1,1>>>
                               (vargs,(v10 *)name,args);
      local_1b8 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_1c8;
      local_f0 = &local_1a8;
      local_1d8 = local_1a8;
      local_1d0 = sStack_1a0;
      local_c8 = &local_1e8;
      local_b8 = 0xf;
      local_1e8.desc_ = 0xf;
      local_1e8.field_1.values_ = local_1b8;
      fmt.size_ = sStack_1a0;
      fmt.data_ = local_1a8;
      local_e8 = local_1d8;
      sStack_e0 = local_1d0;
      local_d0 = local_1b8;
      local_c0 = local_1b8;
      local_b0 = local_c8;
      local_a8 = local_1b8;
      ::fmt::v10::vprint(fmt,local_1e8);
      local_12e0 = "max p degree: {}\n";
      local_12d8 = (v10 *)0x11;
      local_1308[1] = 1;
      local_1308[0] = 10;
      pvVar19 = (v10 *)0xa;
      Eigen::DenseBase<Eigen::Matrix<int,_1,_-1,_1,_1,_-1>_>::LinSpaced
                (&local_1300,10,local_1308 + 1,local_1308);
      local_158 = local_12e0;
      pvStack_150 = local_12d8;
      vargs_1 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,_Eigen::Matrix<int,_1,__1,_1,_1,__1>_>_>
                 *)&local_1300;
      local_178[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<int>,Eigen::Matrix<int,1,_1,1,1,_1>>const>
                               (vargs_1,pvVar19,args_00);
      local_168 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_178;
      local_a0 = &local_158;
      local_188 = local_158;
      local_180 = pvStack_150;
      local_78 = &local_198;
      local_68 = 0xf;
      local_198.desc_ = 0xf;
      local_198.field_1.values_ = local_168;
      fmt_00.size_ = (size_t)pvStack_150;
      fmt_00.data_ = local_158;
      pvVar19 = pvStack_150;
      local_98 = local_188;
      pvStack_90 = local_180;
      local_80 = local_168;
      local_70 = local_168;
      local_60 = local_78;
      local_58 = local_168;
      ::fmt::v10::vprint(fmt_00,local_198);
      local_1320._8_8_ = "L2 errors   : {}\n";
      local_1310 = 0x11;
      local_1320._0_8_ =
           Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                     ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_470);
      local_100 = (char *)local_1320._8_8_;
      sStack_f8 = local_1310;
      vargs_2 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)local_1320;
      local_128[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>
                               (vargs_2,pvVar19,args_01);
      local_110 = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_128;
      local_50 = &local_100;
      local_138 = local_100;
      local_130 = sStack_f8;
      local_30 = &local_148;
      local_20 = 0xf;
      local_148.desc_ = 0xf;
      local_148.field_1.values_ = local_110;
      fmt_01.size_ = sStack_f8;
      fmt_01.data_ = local_100;
      local_48 = local_138;
      sStack_40 = local_130;
      local_38 = local_110;
      local_28 = local_110;
      local_18 = local_30;
      local_10 = local_110;
      ::fmt::v10::vprint(fmt_01,local_148);
      Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&level);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_470);
      lf::refinement::MeshHierarchy::~MeshHierarchy((MeshHierarchy *)(local_448 + 0x10));
      lf::io::GmshReader::~GmshReader((GmshReader *)local_328);
      std::filesystem::__cxx11::path::~path((path *)local_218);
      return path._36_4_;
    }
    lf::refinement::MeshHierarchy::getMesh
              ((MeshHierarchy *)&adjacent_cells.codim_,(int)local_448 + 0x10);
    std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
              ((shared_ptr<lf::mesh::Mesh_const> *)&__range2,
               (shared_ptr<lf::mesh::Mesh> *)&adjacent_cells.codim_);
    lf::mesh::utils::
    CodimMeshDataSet<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
    ::CodimMeshDataSet((CodimMeshDataSet<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                        *)local_4d8,(shared_ptr<const_lf::mesh::Mesh> *)&__range2,2);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
              ((shared_ptr<const_lf::mesh::Mesh> *)&__range2);
    peVar7 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&adjacent_cells.codim_);
    iVar4 = (*peVar7->_vptr_Mesh[2])(peVar7,0);
    __begin2._M_current = (Entity **)CONCAT44(extraout_var,iVar4);
    __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
    ep = (Entity **)
         std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                   ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
    while( true ) {
      bVar3 = __gnu_cxx::
              operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                  *)&ep);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      ppEVar9 = __gnu_cxx::
                __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                ::operator*(&__end2);
      iVar4 = (*(*ppEVar9)->_vptr_Entity[1])(*ppEVar9,2);
      __begin3._M_current = (Entity **)CONCAT44(extraout_var_00,iVar4);
      __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
      sp = (Entity **)
           std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
      while( true ) {
        bVar3 = __gnu_cxx::
                operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                          (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                    *)&sp);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        ppEVar8 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                  ::operator*(&__end3);
        pvVar10 = lf::mesh::utils::
                  CodimMeshDataSet<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                  ::operator()((CodimMeshDataSet<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                                *)local_4d8,*ppEVar8);
        std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::push_back
                  (pvVar10,ppEVar9);
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end2);
    }
    Eigen::Matrix<double,_0,_1,_0,_0,_1>::Matrix
              ((Matrix<double,_0,_1,_0,_0,_1> *)((long)&origin._M_current + 7));
    peVar7 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&adjacent_cells.codim_);
    iVar4 = (*peVar7->_vptr_Mesh[2])(peVar7,2);
    local_570._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar4);
    local_560._M_current =
         (Entity **)
         std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin(&local_570);
    peVar7 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&adjacent_cells.codim_);
    iVar4 = (*peVar7->_vptr_Mesh[2])(peVar7,2);
    local_588._M_ptr = (pointer)CONCAT44(extraout_var_02,iVar4);
    local_578 = (Entity **)
                std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end(&local_588);
    degrees.data_.m_holder.m_capacity = (long)&origin._M_current + 7;
    local_558 = std::
                find_if<__gnu_cxx::__normal_iterator<lf::mesh::Entity_const*const*,std::span<lf::mesh::Entity_const*const,18446744073709551615ul>>,main::__1>
                          (local_560,
                           (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                            )local_578,
                           (anon_class_8_1_8994aba6_for__M_pred)degrees.data_.m_holder.m_capacity);
    std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
              ((shared_ptr<lf::mesh::Mesh_const> *)&__range2_1,
               (shared_ptr<lf::mesh::Mesh> *)&adjacent_cells.codim_);
    lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>::AllCodimMeshDataSet<unsigned_int,void>
              ((AllCodimMeshDataSet<unsigned_int> *)local_5c8,
               (shared_ptr<const_lf::mesh::Mesh> *)&__range2_1,
               (uint)mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 1);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
              ((shared_ptr<const_lf::mesh::Mesh> *)&__range2_1);
    ppEVar9 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&local_558);
    pvVar10 = lf::mesh::utils::
              CodimMeshDataSet<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
              ::operator()((CodimMeshDataSet<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                            *)local_4d8,*ppEVar9);
    __end2_1 = std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::
               begin(pvVar10);
    ep_1 = (Entity **)
           std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::end
                     (pvVar10);
    while( true ) {
      bVar3 = __gnu_cxx::
              operator==<const_lf::mesh::Entity_**,_std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                        (&__end2_1,
                         (__normal_iterator<const_lf::mesh::Entity_**,_std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                          *)&ep_1);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      ppEVar11 = __gnu_cxx::
                 __normal_iterator<const_lf::mesh::Entity_**,_std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                 ::operator*(&__end2_1);
      puVar12 = lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                          ((AllCodimMeshDataSet<unsigned_int> *)local_5c8,*ppEVar11);
      *puVar12 = 1;
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_**,_std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
      ::operator++(&__end2_1);
    }
    for (__range3_1._4_4_ = 0;
        __range3_1._4_4_ <
        (uint)mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        __range3_1._4_4_ = __range3_1._4_4_ + 1) {
      peVar7 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&adjacent_cells.codim_);
      iVar4 = (*peVar7->_vptr_Mesh[2])(peVar7,0);
      __begin3_1._M_current = (Entity **)CONCAT44(extraout_var_03,iVar4);
      __end3_1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                            &__begin3_1);
      ep_2 = (Entity **)
             std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_1);
      while( true ) {
        bVar3 = __gnu_cxx::
                operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                          (&__end3_1,
                           (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                            *)&ep_2);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        ppEVar9 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                  ::operator*(&__end3_1);
        puVar12 = lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                            ((AllCodimMeshDataSet<unsigned_int> *)local_5c8,*ppEVar9);
        if (*puVar12 == __range3_1._4_4_ + 1) {
          iVar4 = (*(*ppEVar9)->_vptr_Entity[1])(*ppEVar9,2);
          __begin5._M_current = (Entity **)CONCAT44(extraout_var_04,iVar4);
          __end5 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              &__begin5);
          sp_1 = (Entity **)
                 std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin5
                           );
          while( true ) {
            bVar3 = __gnu_cxx::
                    operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                              (&__end5,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                        *)&sp_1);
            if (((bVar3 ^ 0xffU) & 1) == 0) break;
            ppEVar9 = __gnu_cxx::
                      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      ::operator*(&__end5);
            pvVar10 = lf::mesh::utils::
                      CodimMeshDataSet<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                      ::operator()((CodimMeshDataSet<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                                    *)local_4d8,*ppEVar9);
            __end6 = std::
                     vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::
                     begin(pvVar10);
            neighbor = (Entity **)
                       std::
                       vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::
                       end(pvVar10);
            while( true ) {
              bVar3 = __gnu_cxx::
                      operator==<const_lf::mesh::Entity_**,_std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                                (&__end6,(__normal_iterator<const_lf::mesh::Entity_**,_std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                                          *)&neighbor);
              if (((bVar3 ^ 0xffU) & 1) == 0) break;
              local_680 = __gnu_cxx::
                          __normal_iterator<const_lf::mesh::Entity_**,_std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                          ::operator*(&__end6);
              puVar12 = lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                                  ((AllCodimMeshDataSet<unsigned_int> *)local_5c8,*local_680);
              __range2_2._4_4_ = __range3_1._4_4_ + 2;
              puVar12 = std::min<unsigned_int>(puVar12,(uint *)((long)&__range2_2 + 4));
              uVar1 = *puVar12;
              puVar12 = lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                                  ((AllCodimMeshDataSet<unsigned_int> *)local_5c8,*local_680);
              *puVar12 = uVar1;
              __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_**,_std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
              ::operator++(&__end6);
            }
            __gnu_cxx::
            __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
            ::operator++(&__end5);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&__end3_1);
      }
    }
    peVar7 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&adjacent_cells.codim_);
    iVar4 = (*peVar7->_vptr_Mesh[2])(peVar7,1);
    __begin2_2._M_current = (Entity **)CONCAT44(extraout_var_05,iVar4);
    __end2_2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_2
                         );
    edge_p = (Entity *)
             std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_2);
    while( true ) {
      bVar3 = __gnu_cxx::
              operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        (&__end2_2,
                         (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                          *)&edge_p);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      ppEVar9 = __gnu_cxx::
                __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                ::operator*(&__end2_2);
      puVar12 = lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                          ((AllCodimMeshDataSet<unsigned_int> *)local_5c8,*ppEVar9);
      *puVar12 = 1000;
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end2_2);
    }
    peVar7 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&adjacent_cells.codim_);
    iVar4 = (*peVar7->_vptr_Mesh[2])(peVar7,0);
    __begin2_3._M_current = (Entity **)CONCAT44(extraout_var_06,iVar4);
    __end2_3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_3
                         );
    ep_3 = (Entity *)
           std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_3);
    while( true ) {
      bVar3 = __gnu_cxx::
              operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        (&__end2_3,
                         (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                          *)&ep_3);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      ppEVar9 = __gnu_cxx::
                __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                ::operator*(&__end2_3);
      pEStack_6e8 = *ppEVar9;
      puVar12 = lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                          ((AllCodimMeshDataSet<unsigned_int> *)local_5c8,pEStack_6e8);
      __range3_2._4_4_ = *puVar12;
      iVar4 = (*pEStack_6e8->_vptr_Entity[1])(pEStack_6e8,1);
      __begin3_2._M_current = (Entity **)CONCAT44(extraout_var_07,iVar4);
      __end3_2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                            &__begin3_2);
      edge_p_1 = (Entity *)
                 std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                            &__begin3_2);
      while( true ) {
        bVar3 = __gnu_cxx::
                operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                          (&__end3_2,
                           (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                            *)&edge_p_1);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        ppEVar9 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                  ::operator*(&__end3_2);
        fes.super___shared_ptr<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppEVar9;
        puVar12 = lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                            ((AllCodimMeshDataSet<unsigned_int> *)local_5c8,
                             (Entity *)
                             fes.
                             super___shared_ptr<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
        puVar12 = std::min<unsigned_int>(puVar12,(uint *)((long)&__range3_2 + 4));
        uVar1 = *puVar12;
        puVar12 = lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                            ((AllCodimMeshDataSet<unsigned_int> *)local_5c8,
                             (Entity *)
                             fes.
                             super___shared_ptr<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
        *puVar12 = uVar1;
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&__end3_2);
      }
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end2_3);
    }
    std::
    make_shared<lf::fe::HierarchicScalarFESpace<double>,std::shared_ptr<lf::mesh::Mesh>&,lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>&>
              ((shared_ptr<lf::mesh::Mesh> *)local_730,
               (AllCodimMeshDataSet<unsigned_int> *)&adjacent_cells.codim_);
    peVar13 = std::
              __shared_ptr_access<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_730);
    iVar4 = (*(peVar13->super_ScalarFESpace<double>)._vptr_ScalarFESpace[1])();
    on_boundary._52_4_ = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x10))();
    this = &diffusion_emp.qr_cache_.cache_._M_elems[4].
            super__Deque_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
    std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
              ((shared_ptr<lf::mesh::Mesh_const> *)this,
               (shared_ptr<lf::mesh::Mesh> *)&adjacent_cells.codim_);
    lf::mesh::utils::flagEntitiesOnBoundary
              ((CodimMeshDataSet<bool> *)local_770,(shared_ptr<const_lf::mesh::Mesh> *)this,1);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
              ((shared_ptr<const_lf::mesh::Mesh> *)
               &diffusion_emp.qr_cache_.cache_._M_elems[4].
                super__Deque_base<lf::quad::QuadRule,_std::allocator<lf::quad::QuadRule>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node);
    std::shared_ptr<lf::fe::ScalarFESpace<double>const>::
    shared_ptr<lf::fe::HierarchicScalarFESpace<double>,void>
              ((shared_ptr<lf::fe::ScalarFESpace<double>const> *)&local_938,
               (shared_ptr<lf::fe::HierarchicScalarFESpace<double>_> *)local_730);
    lf::fe::DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>::
    DiffusionElementMatrixProvider
              ((DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
                *)local_928,&local_938,
               (MeshFunctionConstant<double>)
               mesh_hierarchy.refinement_edges_.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<const_lf::fe::ScalarFESpace<double>_>::~shared_ptr(&local_938);
    lf::assemble::COOMatrix<double>::COOMatrix
              ((COOMatrix<double> *)
               &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               on_boundary._52_4_,on_boundary._52_4_);
    peVar13 = std::
              __shared_ptr_access<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_730);
    iVar4 = (*(peVar13->super_ScalarFESpace<double>)._vptr_ScalarFESpace[1])();
    peVar13 = std::
              __shared_ptr_access<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_730);
    iVar5 = (*(peVar13->super_ScalarFESpace<double>)._vptr_ScalarFESpace[1])();
    lf::assemble::
    AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_lf::fe::DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>_>
              (0,(DofHandler *)CONCAT44(extraout_var_09,iVar4),
               (DofHandler *)CONCAT44(extraout_var_10,iVar5),
               (DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
                *)local_928,
               (COOMatrix<double> *)
               &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &bnd_cond.
                super__Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint *)&on_boundary.field_0x34);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &bnd_cond.
                super__Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    peVar13 = std::
              __shared_ptr_access<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_730);
    local_990.on_boundary = (CodimMeshDataSet<bool> *)local_770;
    lf::fe::
    InitEssentialConditionFromFunction<double,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_fe_hp_fem_L_shape_main_cc:107:15),_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_fe_hp_fem_L_shape_main_cc:27:43)>_>
              ((vector<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_> *)
               local_988,&peVar13->super_ScalarFESpace<double>,&local_990,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_fe_hp_fem_L_shape_main_cc:27:43)>
                *)local_370);
    lhs.m_data.m_allocatedSize = (Index)local_988;
    lf::assemble::FixFlaggedSolutionComponents<double,main::__3,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((anon_class_8_1_171acee7 *)&lhs.m_data.m_allocatedSize,
               (COOMatrix<double> *)
               &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (Matrix<double,__1,_1,_0,__1,_1> *)
               &bnd_cond.
                super__Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    lf::assemble::COOMatrix<double>::makeSparse
              ((SparseMatrix<double,_0,_int> *)
               &solver.
                super_SimplicialCholeskyBase<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                .m_shiftScale,
               (COOMatrix<double> *)
               &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    poVar14 = std::operator<<((ostream *)&std::cout,"Solving level ");
    poVar14 = (ostream *)
              std::ostream::operator<<
                        (poVar14,(uint)mesh.
                                       super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
    poVar14 = std::operator<<(poVar14," with ");
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,on_boundary._52_4_);
    std::operator<<(poVar14," dofs");
    iVar4 = lf::base::narrow<int,unsigned_int>(on_boundary._52_4_);
    pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&level,
                         (ulong)(uint)mesh.
                                      super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi);
    *pSVar15 = iVar4;
    Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::
    SimplicialLLT((SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_> *
                  )local_a98,
                  (MatrixType *)
                  &solver.
                   super_SimplicialCholeskyBase<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                   .m_shiftScale);
    CVar6 = Eigen::
            SimplicialCholeskyBase<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
            ::info((SimplicialCholeskyBase<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                    *)local_a98);
    if (CVar6 != Success) break;
    SVar20 = Eigen::
             SparseSolverBase<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
             ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((SparseSolverBase<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
                         *)local_a98,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        &bnd_cond.
                         super__Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_cb0 = SVar20;
    Eigen::
    DenseBase<Eigen::Solve<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::eval((DenseBase<Eigen::Solve<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)local_ca0);
    CVar6 = Eigen::
            SimplicialCholeskyBase<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
            ::info((SimplicialCholeskyBase<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                    *)local_a98);
    if (CVar6 != Success) {
      std::__cxx11::stringstream::stringstream(local_e38);
      std::operator<<(local_e28,"problem while applying sparse cholesky decomposition.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e58,"solver.info() == Eigen::Success",&local_e59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e80,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/fe/hp_fem_L_shape/main.cc"
                 ,&local_e81);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed
                (&local_e58,&local_e80,0x78,
                 (string *)
                 &solution_mf.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
      std::__cxx11::string::~string
                ((string *)
                 &solution_mf.dof_vector_.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
      std::__cxx11::string::~string((string *)&local_e80);
      std::allocator<char>::~allocator(&local_e81);
      std::__cxx11::string::~string((string *)&local_e58);
      std::allocator<char>::~allocator(&local_e59);
      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar16,"this code should not be reached");
      __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::shared_ptr<lf::fe::ScalarFESpace<double>const>::
    shared_ptr<lf::fe::HierarchicScalarFESpace<double>,void>
              ((shared_ptr<lf::fe::ScalarFESpace<double>const> *)&local_ed8,
               (shared_ptr<lf::fe::HierarchicScalarFESpace<double>_> *)local_730);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)&L2error,
               (Matrix<double,__1,_1,_0,__1,_1> *)local_ca0);
    lf::fe::MeshFunctionFE<double,_double>::MeshFunctionFE
              ((MeshFunctionFE<double,_double> *)local_ec8,&local_ed8,
               (Matrix<double,__1,_1,_0,__1,_1> *)&L2error);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&L2error);
    std::shared_ptr<const_lf::fe::ScalarFESpace<double>_>::~shared_ptr(&local_ed8);
    peVar7 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&adjacent_cells.codim_);
    lf::mesh::utils::
    operator-<lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_fe_hp_fem_L_shape_main_cc:27:43)>_>
              (&local_f68,(MeshFunctionFE<double,_double> *)local_ec8,
               (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_fe_hp_fem_L_shape_main_cc:27:43)>
                *)local_370);
    lf::mesh::utils::
    squaredNorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_fe_hp_fem_L_shape_main_cc:27:43)>_>_>
              (&local_f30,&local_f68);
    __x = lf::fe::
          IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_examples_fe_hp_fem_L_shape_main_cc:27:43)>_>_>,_lf::base::PredicateTrue>
                    (peVar7,&local_f30,
                     (uint)mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi * 2 + 10,
                     (PredicateTrue *)&vtk.aux_node_offset_._M_elems[1].field_0x37,0);
    dVar2 = sqrt(__x);
    lf::mesh::utils::
    MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/fe/hp_fem_L_shape/main.cc:27:43)>_>_>
    ::~MeshFunctionUnary(&local_f30);
    lf::mesh::utils::
    MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::fe::MeshFunctionFE<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/fe/hp_fem_L_shape/main.cc:27:43)>_>
    ::~MeshFunctionBinary(&local_f68);
    local_ef0 = dVar2;
    pSVar17 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_470,
                         (ulong)(uint)mesh.
                                      super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi);
    *pSVar17 = dVar2;
    poVar14 = std::operator<<((ostream *)&std::cout,", L2 error: ");
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,local_ef0);
    std::operator<<(poVar14,'\n');
    std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
              ((shared_ptr<lf::mesh::Mesh_const> *)&local_1158,
               (shared_ptr<lf::mesh::Mesh> *)&adjacent_cells.codim_);
    std::__cxx11::to_string
              (&local_11b8,
               (uint)mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
    std::operator+(&local_1198,"L_shape_",&local_11b8);
    std::operator+(&local_1178,&local_1198,".vtk");
    lf::io::VtkWriter::VtkWriter
              ((VtkWriter *)local_1148,&local_1158,&local_1178,0,
               (char)(uint)mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + '\x01');
    std::__cxx11::string::~string((string *)&local_1178);
    std::__cxx11::string::~string((string *)&local_1198);
    std::__cxx11::string::~string((string *)&local_11b8);
    std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_1158);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_11d8,"Degree",&local_11d9);
    lf::io::VtkWriter::WriteCellData
              ((VtkWriter *)local_1148,&local_11d8,(MeshDataSet<unsigned_int> *)local_5c8,0);
    std::__cxx11::string::~string((string *)&local_11d8);
    std::allocator<char>::~allocator(&local_11d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1200,"solution",(allocator<char> *)&marked_edges.field_0x37);
    name = &local_1200;
    lf::io::VtkWriter::WritePointData<lf::fe::MeshFunctionFE<double,_double>_>
              ((VtkWriter *)local_1148,name,(MeshFunctionFE<double,_double> *)local_ec8);
    std::__cxx11::string::~string((string *)&local_1200);
    std::allocator<char>::~allocator((allocator<char> *)&marked_edges.field_0x37);
    if ((uint)mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        < 9) {
      std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
                ((shared_ptr<lf::mesh::Mesh_const> *)&__range3_3,
                 (shared_ptr<lf::mesh::Mesh> *)&adjacent_cells.codim_);
      lf::mesh::utils::CodimMeshDataSet<bool>::CodimMeshDataSet
                ((CodimMeshDataSet<bool> *)local_1240,
                 (shared_ptr<const_lf::mesh::Mesh> *)&__range3_3,1,false);
      std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr
                ((shared_ptr<const_lf::mesh::Mesh> *)&__range3_3);
      peVar7 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&adjacent_cells.codim_);
      iVar4 = (*peVar7->_vptr_Mesh[2])(peVar7,0);
      __begin3_3._M_current = (Entity **)CONCAT44(extraout_var_11,iVar4);
      __end3_3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                            &__begin3_3);
      ep_4 = (Entity *)
             std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_3);
      while( true ) {
        bVar3 = __gnu_cxx::
                operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                          (&__end3_3,
                           (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                            *)&ep_4);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        ppEVar9 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                  ::operator*(&__end3_3);
        e = *ppEVar9;
        puVar12 = lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>::operator()
                            ((AllCodimMeshDataSet<unsigned_int> *)local_5c8,e);
        if (*puVar12 == 1) {
          iVar4 = (*e->_vptr_Entity[1])(e,1);
          __begin5_1._M_current = (Entity **)CONCAT44(extraout_var_12,iVar4);
          __end5_1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                               ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                                &__begin5_1);
          edge_p_2 = (Entity *)
                     std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                               ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                                &__begin5_1);
          while( true ) {
            bVar3 = __gnu_cxx::
                    operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                              (&__end5_1,
                               (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&edge_p_2);
            if (((bVar3 ^ 0xffU) & 1) == 0) break;
            ppEVar9 = __gnu_cxx::
                      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      ::operator*(&__end5_1);
            local_12b8._8_8_ = *ppEVar9;
            pbVar18 = lf::mesh::utils::CodimMeshDataSet<bool>::operator()
                                ((CodimMeshDataSet<bool> *)local_1240,(Entity *)local_12b8._8_8_);
            *pbVar18 = true;
            __gnu_cxx::
            __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
            ::operator++(&__end5_1);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&__end3_3);
      }
      local_12b8._0_8_ = local_1240;
      name = (string *)local_12b8;
      lf::refinement::MeshHierarchy::MarkEdges<main::__4>
                ((MeshHierarchy *)(local_448 + 0x10),(anon_class_8_1_e0c6ce81 *)name);
      lf::refinement::MeshHierarchy::RefineMarked((MeshHierarchy *)(local_448 + 0x10));
      lf::mesh::utils::CodimMeshDataSet<bool>::~CodimMeshDataSet
                ((CodimMeshDataSet<bool> *)local_1240);
    }
    lf::io::VtkWriter::~VtkWriter((VtkWriter *)local_1148);
    lf::fe::MeshFunctionFE<double,_double>::~MeshFunctionFE
              ((MeshFunctionFE<double,_double> *)local_ec8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_ca0);
    Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>::
    ~SimplicialLLT((SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>
                    *)local_a98);
    Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
              ((SparseMatrix<double,_0,_int> *)
               &solver.
                super_SimplicialCholeskyBase<Eigen::SimplicialLLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                .m_shiftScale);
    std::vector<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>::~vector
              ((vector<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_> *)
               local_988);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &bnd_cond.
                super__Vector_base<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    lf::assemble::COOMatrix<double>::~COOMatrix
              ((COOMatrix<double> *)
               &rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    lf::fe::DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>::
    ~DiffusionElementMatrixProvider
              ((DiffusionElementMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>_>
                *)local_928);
    lf::mesh::utils::CodimMeshDataSet<bool>::~CodimMeshDataSet((CodimMeshDataSet<bool> *)local_770);
    std::shared_ptr<lf::fe::HierarchicScalarFESpace<double>_>::~shared_ptr
              ((shared_ptr<lf::fe::HierarchicScalarFESpace<double>_> *)local_730);
    lf::mesh::utils::AllCodimMeshDataSet<unsigned_int>::~AllCodimMeshDataSet
              ((AllCodimMeshDataSet<unsigned_int> *)local_5c8);
    lf::mesh::utils::
    CodimMeshDataSet<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
    ::~CodimMeshDataSet((CodimMeshDataSet<std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>_>
                         *)local_4d8);
    std::shared_ptr<lf::mesh::Mesh>::~shared_ptr
              ((shared_ptr<lf::mesh::Mesh> *)&adjacent_cells.codim_);
    mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         (uint)mesh.super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         + 1;
  }
  std::__cxx11::stringstream::stringstream(local_c20);
  std::operator<<(local_c10,"Sparse Cholesky decomposition was not successful.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c40,"solver.info() == Eigen::Success",&local_c41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c68,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/examples/fe/hp_fem_L_shape/main.cc"
             ,&local_c69);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed
            (&local_c40,&local_c68,0x75,
             (string *)
             &solution_vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  std::__cxx11::string::~string
            ((string *)
             &solution_vec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  std::__cxx11::string::~string((string *)&local_c68);
  std::allocator<char>::~allocator(&local_c69);
  std::__cxx11::string::~string((string *)&local_c40);
  std::allocator<char>::~allocator(&local_c41);
  prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar16,"this code should not be reached");
  __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main() {
  // 1) Load the mesh:
  std::filesystem::path path(__FILE__);
  path = path.parent_path() / "L_shape.msh";
  lf::io::GmshReader reader(
      std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2), path.string());

  // 2) define the exact, analytic solution:
  auto exact_solution =
      lf::mesh::utils::MeshFunctionGlobal([](Eigen::Vector2d x) {
        const double r = x.norm();
        const double theta = std::atan2(x.y(), x.x());
        return std::pow(r, 2. / 3.) *
               std::sin(2. / 3. * (theta + lf::base::kPi / 2.));
      });
  auto diffusion_coefficient = lf::mesh::utils::MeshFunctionConstant(1.);

  // 3) Create mesh hierarchy and loop over levels:
  lf::refinement::MeshHierarchy mesh_hierarchy(
      reader.mesh(), std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2));
  const lf::base::size_type max_level = 9;
  Eigen::VectorXd errors(max_level + 1);
  Eigen::VectorXi num_dofs(max_level + 1);
  for (lf::base::size_type level = 0; level <= max_level; ++level) {
    auto mesh = mesh_hierarchy.getMesh(level);

    // create a MeshDataSet that stores for every point the adjacent cells:
    lf::mesh::utils::CodimMeshDataSet<std::vector<const lf::mesh::Entity*>>
        adjacent_cells(mesh, 2);
    for (const auto& ep : mesh->Entities(0)) {
      for (const auto& sp : ep->SubEntities(2)) {
        adjacent_cells(*sp).push_back(ep);
      }
    }

    // find the point entity at the origin (0,0):
    Eigen::Matrix<double, 0, 1> zero;
    const auto origin = std::find_if(
        mesh->Entities(2).begin(), mesh->Entities(2).end(), [&](auto ep) {
          auto coord = ep->Geometry()->Global(zero);
          return coord.norm() < 1e-10;
        });

    // 4) create a hp-approximation space where the degree of the elements
    // adjacent to the origin have degree 1. From there the degree is then
    // linearly increasing to level+1.
    lf::mesh::utils::AllCodimMeshDataSet<unsigned> degrees(mesh, level + 1);
    // -> mark the degree of all elements around the origin to be l1:
    for (auto& ep : adjacent_cells(**origin)) {
      degrees(*ep) = 1;
    }
    for (unsigned i = 0; i < level; ++i) {
      for (const auto& ep : mesh->Entities(0)) {
        if (degrees(*ep) == 1 + i) {
          // mark all adjacent cells to have one level more:
          for (const auto& sp : ep->SubEntities(2)) {
            for (const auto& neighbor : adjacent_cells(*sp)) {
              degrees(*neighbor) = std::min(degrees(*neighbor), 2 + i);
            }
          }
        }
      }
    }
    // set the edges to the minimum degree of the two adjacent elements:
    for (const auto* edge_p : mesh->Entities(1)) {
      degrees(*edge_p) = 1000;
    }
    for (const auto* ep : mesh->Entities(0)) {
      auto element_degree = degrees(*ep);
      for (const auto* edge_p : ep->SubEntities(1)) {
        degrees(*edge_p) = std::min(degrees(*edge_p), element_degree);
      }
    }
    auto fes = std::make_shared<lf::fe::HierarchicScalarFESpace<double>>(
        mesh, degrees);

    // 5) solve laplace problem with inhomogeneous dirichlet boundary conditions
    const lf::base::size_type num_dof = fes->LocGlobMap().NumDofs();
    auto on_boundary = lf::mesh::utils::flagEntitiesOnBoundary(mesh, 1);
    lf::fe::DiffusionElementMatrixProvider diffusion_emp(fes,
                                                         diffusion_coefficient);
    lf::assemble::COOMatrix<double> lhs_coo(num_dof, num_dof);
    AssembleMatrixLocally(0, fes->LocGlobMap(), fes->LocGlobMap(),
                          diffusion_emp, lhs_coo);

    Eigen::VectorXd rhs(num_dof);
    rhs.setZero();

    auto bnd_cond = lf::fe::InitEssentialConditionFromFunction(
        *fes, [&](const lf::mesh::Entity& e) { return on_boundary(e); },
        exact_solution);
    lf::assemble::FixFlaggedSolutionComponents(
        [&](auto i) { return bnd_cond[i]; }, lhs_coo, rhs);
    auto lhs = lhs_coo.makeSparse();

    std::cout << "Solving level " << level << " with " << num_dof << " dofs";
    num_dofs(level) = lf::base::narrow<int>(num_dof);
    const Eigen::SimplicialLLT<decltype(lhs)> solver(lhs);
    LF_VERIFY_MSG(solver.info() == Eigen::Success,
                  "Sparse Cholesky decomposition was not successful.");
    auto solution_vec = solver.solve(rhs).eval();
    LF_VERIFY_MSG(solver.info() == Eigen::Success,
                  "problem while applying sparse cholesky decomposition.");

    // 6) Compute L2 error to analytical solution
    auto solution_mf = lf::fe::MeshFunctionFE(fes, solution_vec);

    auto L2error = std::sqrt(lf::fe::IntegrateMeshFunction(
        *mesh, squaredNorm(solution_mf - exact_solution),
        static_cast<int>(2 * (level + 5))));
    errors(level) = L2error;
    std::cout << ", L2 error: " << L2error << '\n';

    // lf::fe::DiffusionElementMatrixProvider laplacian()

    lf::io::VtkWriter vtk(mesh, "L_shape_" + std::to_string(level) + ".vtk", 0,
                          level + 1);
    vtk.WriteCellData("Degree", degrees);
    vtk.WritePointData("solution", solution_mf);

    if (level < max_level) {
      // refine the mesh towards the singularity:
      lf::mesh::utils::CodimMeshDataSet<bool> marked_edges(mesh, 1, false);
      for (const auto* ep : mesh->Entities(0)) {
        if (degrees(*ep) == 1) {
          // mark all adjacent edges:
          for (const auto* edge_p : ep->SubEntities(1)) {
            marked_edges(*edge_p) = true;
          }
        }
      }
      mesh_hierarchy.MarkEdges(
          [&](const lf::mesh::Mesh& /*unused*/, const lf::mesh::Entity& edge) {
            return marked_edges(edge);
          });
      mesh_hierarchy.RefineMarked();
    }
  }

  fmt::print("# dofs      : {}\n", num_dofs.transpose());
  fmt::print("max p degree: {}\n",
             Eigen::RowVectorXi::LinSpaced(max_level + 1, 1, max_level + 1));
  fmt::print("L2 errors   : {}\n", errors.transpose());
}